

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
processOnLeftSideBodyFixedAvgVelocityJacobian
          (KinDynComputationsPrivateAttributes *this,MatrixView<double> *jac)

{
  long lVar1;
  long lVar2;
  Index row;
  Rotation *pRVar3;
  Transform *this_00;
  long lVar4;
  element_type *peVar5;
  pointer peVar6;
  element_type *peVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pointer peVar11;
  bool bVar12;
  type tmp;
  Transform newOutputFrame_X_oldOutputFrame;
  Matrix6x6 newOutputFrame_X_oldOutputFrame_;
  element_type *local_1f8 [2];
  Transform local_1e8 [96];
  Transform *local_188 [2];
  pointer local_178;
  variable_if_dynamic<long,__1> local_170;
  variable_if_dynamic<long,__1> local_168;
  variable_if_dynamic<long,__1> local_160;
  variable_if_dynamic<long,__1> local_158;
  Transform local_150 [288];
  
  iDynTree::Transform::Transform(local_1e8);
  if (this->m_frameVelRepr != BODY_FIXED_REPRESENTATION) {
    if (this->m_frameVelRepr == MIXED_REPRESENTATION) {
      iDynTree::FreeFloatingPos::worldBasePos();
      pRVar3 = (Rotation *)iDynTree::Transform::getRotation();
      iDynTree::Position::Zero();
      this_00 = local_150;
      iDynTree::Transform::Transform(this_00,pRVar3,(Position *)local_188);
    }
    else {
      this_00 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
    }
    iDynTree::Transform::operator=(local_1e8,this_00);
    iDynTree::Transform::asAdjointTransform();
    bVar12 = jac->m_storageOrder == ColumnMajor;
    lVar1 = jac->m_rows;
    lVar9 = 1;
    if (bVar12) {
      lVar9 = lVar1;
    }
    lVar2 = jac->m_cols;
    lVar10 = 1;
    if (!bVar12) {
      lVar10 = lVar2;
    }
    peVar11 = jac->m_storage;
    local_188[0] = local_150;
    local_178 = peVar11;
    local_170.m_value = lVar1;
    local_168.m_value = lVar2;
    local_160.m_value = lVar10;
    local_158.m_value = lVar9;
    Eigen::Matrix<double,6,-1,0,6,-1>::
    Matrix<Eigen::Product<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<_1,_1>>,0>>
              ((Matrix<double,6,_1,0,6,_1> *)local_1f8,
               (Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<_1,__1>_>,_0>
                *)local_188);
    if (0 < lVar1) {
      lVar4 = 0;
      peVar5 = local_1f8[0];
      do {
        peVar6 = peVar11;
        peVar7 = peVar5;
        lVar8 = lVar2;
        if (0 < lVar2) {
          do {
            *peVar6 = *peVar7;
            peVar7 = peVar7 + 6;
            peVar6 = peVar6 + lVar9;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        lVar4 = lVar4 + 1;
        peVar5 = peVar5 + 1;
        peVar11 = peVar11 + lVar10;
      } while (lVar4 != lVar1);
    }
    free(local_1f8[0]);
  }
  return;
}

Assistant:

void KinDynComputations::KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedAvgVelocityJacobian(
      MatrixView<double> jac)
{
    assert(jac.rows() == 6);

    Transform newOutputFrame_X_oldOutputFrame;
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return;
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        Transform & world_X_base = m_pos.worldBasePos();
        newOutputFrame_X_oldOutputFrame = Transform(world_X_base.getRotation(),Position::Zero());
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        newOutputFrame_X_oldOutputFrame = m_pos.worldBasePos();
    }

    Matrix6x6 newOutputFrame_X_oldOutputFrame_ = newOutputFrame_X_oldOutputFrame.asAdjointTransform();

    toEigen(jac) = toEigen(newOutputFrame_X_oldOutputFrame_)*toEigen(jac);
}